

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Write(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  uint fVerbose;
  char *pcVar6;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  fVerbose = 0;
  while( true ) {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"umvh"), iVar3 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar3 == -1) break;
    if (iVar3 == 0x6d) {
      bVar2 = (bool)(bVar2 ^ 1);
    }
    else {
      if (iVar3 != 0x75) {
        Abc_Print(-2,"usage: &w [-umvh] <file>\n");
        Abc_Print(-2,"\t         writes the current AIG into the AIGER file\n");
        pcVar6 = "yes";
        pcVar5 = "yes";
        if (!bVar1) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-u     : toggle writing canonical AIG structure [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (!bVar2) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-m     : toggle writing MiniAIG rather than AIGER [default = %s]\n",pcVar5);
        if (fVerbose == 0) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar6);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        pcVar5 = "\t<file> : the file name\n";
        iVar3 = -2;
LAB_00225f79:
        Abc_Print(iVar3,pcVar5);
        return 1;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
  }
  if (argc - globalUtilOptind == 1) {
    pGVar4 = pAbc->pGia;
    if (pGVar4 != (Gia_Man_t *)0x0) {
      pcVar5 = argv[globalUtilOptind];
      if (bVar1) {
        pGVar4 = Gia_ManIsoCanonicize(pGVar4,fVerbose);
        Gia_AigerWriteSimple(pGVar4,pcVar5);
        Gia_ManStop(pGVar4);
      }
      else {
        if (!bVar2) {
          Gia_AigerWrite(pGVar4,pcVar5,0,0);
          return 0;
        }
        Gia_ManWriteMiniAig(pGVar4,pcVar5);
      }
      return 0;
    }
    pcVar5 = "Abc_CommandAbc9Write(): There is no AIG to write.\n";
  }
  else {
    pcVar5 = "There is no file name.\n";
  }
  iVar3 = -1;
  goto LAB_00225f79;
}

Assistant:

int Abc_CommandAbc9Write( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char * pFileName;
    char ** pArgvNew;
    int c, nArgcNew;
    int fUnique = 0;
    int fMiniAig = 0;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "umvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'u':
            fUnique ^= 1;
            break;
        case 'm':
            fMiniAig ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Write(): There is no AIG to write.\n" );
        return 1;
    }
    pFileName = argv[globalUtilOptind];
    if ( fUnique )
    {
        Gia_Man_t * pGia = Gia_ManIsoCanonicize( pAbc->pGia, fVerbose );
        Gia_AigerWriteSimple( pGia, pFileName );
        Gia_ManStop( pGia );
    }
    else if ( fMiniAig )
        Gia_ManWriteMiniAig( pAbc->pGia, pFileName );
    else
        Gia_AigerWrite( pAbc->pGia, pFileName, 0, 0 );
    return 0;

usage:
    Abc_Print( -2, "usage: &w [-umvh] <file>\n" );
    Abc_Print( -2, "\t         writes the current AIG into the AIGER file\n" );
    Abc_Print( -2, "\t-u     : toggle writing canonical AIG structure [default = %s]\n", fUnique? "yes" : "no" );
    Abc_Print( -2, "\t-m     : toggle writing MiniAIG rather than AIGER [default = %s]\n", fMiniAig? "yes" : "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}